

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O0

Wln_Ntk_t * Wln_NtkFromNdr(void *pData)

{
  Wln_Ntk_t *pWVar1;
  Vec_Ptr_t *p_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int *Entry;
  Abc_Nam_t *pAVar5;
  char *pStr;
  char local_f8 [8];
  char pName [20];
  int InstId_2;
  int NameId_3;
  int iObj_3;
  int nArray_1;
  int Signed_2;
  int Beg_2;
  int End_2;
  int InstId_1;
  int NameId_2;
  int iObj_2;
  Vec_Int_t *vTemp;
  Vec_Int_t F;
  int nArray;
  int Type;
  int Signed_1;
  int Beg_1;
  int End_1;
  int InstId;
  int NameId_1;
  int iObj_1;
  int Signed;
  int Beg;
  int End;
  Wln_Ntk_t *pNtk;
  Wln_Ntk_t *pTemp;
  int NameIdMax;
  int NameId;
  int fFound;
  int nDigits;
  int *pArray;
  int Obj;
  int iObj;
  int iFanin;
  int k;
  int i;
  int Mod;
  Vec_Ptr_t *vConstStrings;
  Vec_Int_t *vFanins;
  Vec_Int_t *vName2Obj;
  Ndr_Data_t *p;
  void *pData_local;
  
  vName2Obj = (Vec_Int_t *)pData;
  p = (Ndr_Data_t *)pData;
  vConstStrings = (Vec_Ptr_t *)Vec_IntAlloc(100);
  _i = Vec_PtrAlloc(100);
  k = 2;
  iVar2 = Ndr_DataObjNum((Ndr_Data_t *)vName2Obj,2);
  _Beg = Wln_NtkAlloc("top",iVar2);
  Wln_NtkCheckIntegrity(p);
  Wln_NtkCleanNameId(_Beg);
  Wln_NtkCleanInstId(_Beg);
  for (pArray._0_4_ = k + 1; iVar2 = (int)pArray, iVar3 = Ndr_DataEnd((Ndr_Data_t *)vName2Obj,k),
      iVar2 < iVar3; pArray._0_4_ = iVar2 + (int)pArray) {
    iVar2 = Ndr_DataType((Ndr_Data_t *)vName2Obj,(int)pArray);
    if ((iVar2 == 3) && (iVar2 = Ndr_ObjIsType((Ndr_Data_t *)vName2Obj,(int)pArray,3), iVar2 != 0))
    {
      NameId_1 = Ndr_ObjGetRange((Ndr_Data_t *)vName2Obj,(int)pArray,&Signed,&iObj_1);
      InstId = Wln_ObjAlloc(_Beg,3,NameId_1,Signed,iObj_1);
      End_1 = Ndr_ObjReadBody((Ndr_Data_t *)vName2Obj,(int)pArray,5);
      Beg_1 = Ndr_ObjReadBody((Ndr_Data_t *)vName2Obj,(int)pArray,7);
      Wln_ObjSetNameId(_Beg,InstId,End_1);
      if (0 < Beg_1) {
        Wln_ObjSetInstId(_Beg,InstId,Beg_1);
      }
    }
    iVar2 = Ndr_DataSize((Ndr_Data_t *)vName2Obj,(int)pArray);
  }
  for (pArray._0_4_ = k + 1; iVar2 = (int)pArray, iVar3 = Ndr_DataEnd((Ndr_Data_t *)vName2Obj,k),
      iVar2 < iVar3; pArray._0_4_ = iVar2 + (int)pArray) {
    iVar2 = Ndr_DataType((Ndr_Data_t *)vName2Obj,(int)pArray);
    if (((iVar2 == 3) && (iVar2 = Ndr_ObjIsType((Ndr_Data_t *)vName2Obj,(int)pArray,3), iVar2 == 0))
       && (iVar2 = Ndr_ObjIsType((Ndr_Data_t *)vName2Obj,(int)pArray,4), iVar2 == 0)) {
      iVar2 = Ndr_ObjGetRange((Ndr_Data_t *)vName2Obj,(int)pArray,&Signed_1,&Type);
      iVar3 = Ndr_ObjReadBody((Ndr_Data_t *)vName2Obj,(int)pArray,6);
      vTemp._0_4_ = Ndr_ObjReadArray((Ndr_Data_t *)vName2Obj,(int)pArray,4,(int **)&fFound);
      F._0_8_ = _fFound;
      _NameId_2 = (Vec_Int_t *)&vTemp;
      vTemp._4_4_ = (int)vTemp;
      F.pArray._4_4_ = (int)vTemp;
      InstId_1 = Wln_ObjAlloc(_Beg,iVar3,iVar2,Signed_1,Type);
      End_2 = Ndr_ObjReadBody((Ndr_Data_t *)vName2Obj,(int)pArray,5);
      Beg_2 = Ndr_ObjReadBody((Ndr_Data_t *)vName2Obj,(int)pArray,7);
      Vec_IntClear((Vec_Int_t *)vConstStrings);
      Vec_IntAppend((Vec_Int_t *)vConstStrings,_NameId_2);
      if (iVar3 == 0x58) {
        __assert_fail("Type != ABC_OPER_DFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                      ,0xd6,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
      }
      iVar4 = Wln_ObjIsSlice(_Beg,InstId_1);
      pWVar1 = _Beg;
      iVar2 = InstId_1;
      if (iVar4 == 0) {
        iVar2 = Wln_ObjIsConst(_Beg,InstId_1);
        p_00 = _i;
        if (iVar2 != 0) {
          Entry = Ndr_ObjReadBodyP((Ndr_Data_t *)vName2Obj,(int)pArray,9);
          Vec_PtrPush(p_00,Entry);
        }
      }
      else {
        iVar4 = Hash_Int2ManInsert(_Beg->pRanges,Signed_1,Type,0);
        Wln_ObjSetSlice(pWVar1,iVar2,iVar4);
      }
      Wln_ObjAddFanins(_Beg,InstId_1,(Vec_Int_t *)vConstStrings);
      Wln_ObjSetNameId(_Beg,InstId_1,End_2);
      if (0 < Beg_2) {
        Wln_ObjSetInstId(_Beg,InstId_1,Beg_2);
      }
      if (iVar3 == 0x35) {
        iVar2 = Wln_ObjFaninNum(_Beg,InstId_1);
        pWVar1 = _Beg;
        if (iVar2 != 2) {
          __assert_fail("Wln_ObjFaninNum(pNtk, iObj) == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                        ,0xe2,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
        }
        iVar2 = Wln_ObjFanin0(_Beg,InstId_1);
        Wln_ObjSetSigned(pWVar1,iVar2);
        pWVar1 = _Beg;
        iVar2 = Wln_ObjFanin1(_Beg,InstId_1);
        Wln_ObjSetSigned(pWVar1,iVar2);
      }
    }
    iVar2 = Ndr_DataSize((Ndr_Data_t *)vName2Obj,(int)pArray);
  }
  for (pArray._0_4_ = k + 1; iVar2 = (int)pArray, iVar3 = Ndr_DataEnd((Ndr_Data_t *)vName2Obj,k),
      iVar2 < iVar3; pArray._0_4_ = iVar2 + (int)pArray) {
    iVar2 = Ndr_DataType((Ndr_Data_t *)vName2Obj,(int)pArray);
    if ((iVar2 == 3) && (iVar2 = Ndr_ObjIsType((Ndr_Data_t *)vName2Obj,(int)pArray,4), iVar2 != 0))
    {
      iVar2 = Ndr_ObjGetRange((Ndr_Data_t *)vName2Obj,(int)pArray,&Signed_2,&nArray_1);
      iVar3 = Ndr_ObjReadArray((Ndr_Data_t *)vName2Obj,(int)pArray,4,(int **)&fFound);
      iVar2 = Wln_ObjAlloc(_Beg,4,iVar2,Signed_2,nArray_1);
      iVar4 = Ndr_ObjReadBody((Ndr_Data_t *)vName2Obj,(int)pArray,5);
      pName._16_4_ = Ndr_ObjReadBody((Ndr_Data_t *)vName2Obj,(int)pArray,7);
      if ((iVar3 != 1) || ((iVar4 != -1 || (pName._16_4_ != -1)))) {
        __assert_fail("nArray == 1 && NameId == -1 && InstId == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                      ,0xef,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
      }
      Wln_ObjAddFanin(_Beg,iVar2,*_fFound);
    }
    iVar2 = Ndr_DataSize((Ndr_Data_t *)vName2Obj,(int)pArray);
  }
  Vec_IntFree((Vec_Int_t *)vConstStrings);
  iVar2 = Vec_IntCountPositive(&_Beg->vInstIds);
  if (iVar2 == 0) {
    Vec_IntErase(&_Beg->vInstIds);
  }
  vFanins = Vec_IntInvert(&_Beg->vNameIds,0);
  for (iFanin = 1; iVar2 = iFanin, iVar3 = Wln_NtkObjNum(_Beg), iVar2 < iVar3; iFanin = iFanin + 1)
  {
    for (iObj = 0; iVar2 = iObj, iVar3 = Wln_ObjFaninNum(_Beg,iFanin), iVar2 < iVar3;
        iObj = iObj + 1) {
      Obj = Wln_ObjFanin(_Beg,iFanin,iObj);
      iVar3 = iFanin;
      iVar2 = iObj;
      pWVar1 = _Beg;
      if (Obj != 0) {
        iVar4 = Vec_IntEntry(vFanins,Obj);
        Wln_ObjSetFanin(pWVar1,iVar3,iVar2,iVar4);
      }
    }
  }
  Vec_IntFree(vFanins);
  pTemp._0_4_ = Vec_IntFindMax(&_Beg->vNameIds);
  NameId = Abc_Base10Log((int)pTemp + 1);
  pAVar5 = Abc_NamStart((int)pTemp + 1,10);
  _Beg->pManName = pAVar5;
  for (iFanin = 1; iFanin <= (int)pTemp; iFanin = iFanin + 1) {
    sprintf(local_f8,"s%0*d",(ulong)(uint)NameId,(ulong)(uint)iFanin);
    pTemp._4_4_ = Abc_NamStrFindOrAdd(_Beg->pManName,local_f8,&NameIdMax);
    if ((NameIdMax != 0) || (iFanin != pTemp._4_4_)) {
      __assert_fail("!fFound && i == NameId",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                    ,0x105,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
    }
  }
  iFanin = 0;
  for (pArray._4_4_ = 1; iVar2 = pArray._4_4_, iVar4 = Wln_NtkObjNum(_Beg), iVar3 = iFanin,
      iVar2 < iVar4; pArray._4_4_ = pArray._4_4_ + 1) {
    iVar4 = Wln_ObjIsConst(_Beg,pArray._4_4_);
    iVar3 = iFanin;
    iVar2 = pArray._4_4_;
    pWVar1 = _Beg;
    if (iVar4 != 0) {
      pAVar5 = _Beg->pManName;
      iFanin = iFanin + 1;
      pStr = (char *)Vec_PtrEntry(_i,iVar3);
      iVar3 = Abc_NamStrFindOrAdd(pAVar5,pStr,(int *)0x0);
      Wln_ObjSetConst(pWVar1,iVar2,iVar3);
    }
  }
  iVar2 = Vec_PtrSize(_i);
  if (iVar3 == iVar2) {
    Vec_PtrFree(_i);
    Wln_WriteVer(_Beg,"temp_ndr.v");
    printf("Dumped design \"%s\" into file \"temp_ndr.v\".\n",_Beg->pName);
    pNtk = _Beg;
    _Beg = Wln_NtkDupDfs(_Beg);
    Wln_NtkFree(pNtk);
    return _Beg;
  }
  __assert_fail("i == Vec_PtrSize(vConstStrings)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                ,0x10c,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
}

Assistant:

Wln_Ntk_t * Wln_NtkFromNdr( void * pData )
{
    Ndr_Data_t * p = (Ndr_Data_t *)pData;  
    Vec_Int_t * vName2Obj, * vFanins = Vec_IntAlloc( 100 );
    Vec_Ptr_t * vConstStrings = Vec_PtrAlloc( 100 );
    int Mod = 2, i, k, iFanin, iObj, Obj, * pArray, nDigits, fFound, NameId, NameIdMax;
    Wln_Ntk_t * pTemp, * pNtk = Wln_NtkAlloc( "top", Ndr_DataObjNum(p, Mod) );
    Wln_NtkCheckIntegrity( pData );
    //pNtk->pSpec = Abc_UtilStrsav( pFileName );
    // construct network and save name IDs
    Wln_NtkCleanNameId( pNtk );
    Wln_NtkCleanInstId( pNtk );
    Ndr_ModForEachPi( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjGetRange(p, Obj, &End, &Beg);
        int iObj = Wln_ObjAlloc( pNtk, ABC_OPER_CI, Signed, End, Beg );
        int NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        int InstId = Ndr_ObjReadBody( p, Obj, NDR_NAME );
        Wln_ObjSetNameId( pNtk, iObj, NameId );
        if ( InstId > 0 ) Wln_ObjSetInstId( pNtk, iObj, InstId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjGetRange(p, Obj, &End, &Beg);
        int Type    = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        int nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        Vec_Int_t F = {nArray, nArray, pArray}, * vTemp = &F;
        int iObj    = Wln_ObjAlloc( pNtk, Type, Signed, End, Beg );
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        int InstId  = Ndr_ObjReadBody( p, Obj, NDR_NAME );
        Vec_IntClear( vFanins );
        Vec_IntAppend( vFanins, vTemp );
        assert( Type != ABC_OPER_DFF );
        if ( Wln_ObjIsSlice(pNtk, iObj) )
            Wln_ObjSetSlice( pNtk, iObj, Hash_Int2ManInsert(pNtk->pRanges, End, Beg, 0) );
        else if ( Wln_ObjIsConst(pNtk, iObj) )
            Vec_PtrPush( vConstStrings, (char *)Ndr_ObjReadBodyP(p, Obj, NDR_FUNCTION) );
//        else if ( Type == ABC_OPER_BIT_MUX && Vec_IntSize(vFanins) == 3 )
//            ABC_SWAP( int, Wln_ObjFanins(pNtk, iObj)[1], Wln_ObjFanins(pNtk, iObj)[2] );
        Wln_ObjAddFanins( pNtk, iObj, vFanins );
        Wln_ObjSetNameId( pNtk, iObj, NameId );
        if ( InstId > 0 ) Wln_ObjSetInstId( pNtk, iObj, InstId );
        if ( Type == ABC_OPER_ARI_SMUL )
        {
            assert( Wln_ObjFaninNum(pNtk, iObj) == 2 );
            Wln_ObjSetSigned( pNtk, Wln_ObjFanin0(pNtk, iObj) );
            Wln_ObjSetSigned( pNtk, Wln_ObjFanin1(pNtk, iObj) );
        }
    }
    // mark primary outputs
    Ndr_ModForEachPo( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjGetRange(p, Obj, &End, &Beg);
        int nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        int iObj    = Wln_ObjAlloc( pNtk, ABC_OPER_CO, Signed, End, Beg );
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        int InstId  = Ndr_ObjReadBody( p, Obj, NDR_NAME );
        assert( nArray == 1 && NameId == -1 && InstId == -1 );
        Wln_ObjAddFanin( pNtk, iObj, pArray[0] );
    }
    Vec_IntFree( vFanins );
    // remove instance names if they are not given
    //Vec_IntPrint( &pNtk->vInstIds );
    if ( Vec_IntCountPositive(&pNtk->vInstIds) == 0 )
        Vec_IntErase( &pNtk->vInstIds );
    // map name IDs into object IDs
    vName2Obj = Vec_IntInvert( &pNtk->vNameIds, 0 );
    Wln_NtkForEachObj( pNtk, i )
        Wln_ObjForEachFanin( pNtk, i, iFanin, k )
            Wln_ObjSetFanin( pNtk, i, k, Vec_IntEntry(vName2Obj, iFanin) );
    Vec_IntFree(vName2Obj);
    // create fake object names
    NameIdMax = Vec_IntFindMax(&pNtk->vNameIds);
    nDigits = Abc_Base10Log( NameIdMax+1 );
    pNtk->pManName = Abc_NamStart( NameIdMax+1, 10 );
    for ( i = 1; i <= NameIdMax; i++ )
    {
        char pName[20]; sprintf( pName, "s%0*d", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pName, &fFound );
        assert( !fFound && i == NameId );
    }
    // add const strings
    i = 0;
    Wln_NtkForEachObj( pNtk, iObj )
        if ( Wln_ObjIsConst(pNtk, iObj) )
            Wln_ObjSetConst( pNtk, iObj, Abc_NamStrFindOrAdd(pNtk->pManName, (char *)Vec_PtrEntry(vConstStrings, i++), NULL) );
    assert( i == Vec_PtrSize(vConstStrings) );
    Vec_PtrFree( vConstStrings );
    //Ndr_NtkPrintObjects( pNtk );
    Wln_WriteVer( pNtk, "temp_ndr.v" );
    printf( "Dumped design \"%s\" into file \"temp_ndr.v\".\n", pNtk->pName );
    // derive topological order
    pNtk = Wln_NtkDupDfs( pTemp = pNtk );
    Wln_NtkFree( pTemp );
    //Ndr_NtkPrintObjects( pNtk );
    //pNtk->fMemPorts = 1;          // the network contains memory ports
    //pNtk->fEasyFfs = 1;           // the network contains simple flops
    return pNtk;
}